

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void Train(string *filename)

{
  short sVar1;
  short sVar2;
  pointer psVar3;
  pointer psVar4;
  int __fd;
  clock_t cVar5;
  clock_t cVar6;
  long lVar7;
  thread t3;
  short cnt_label1_part3;
  short cnt_label0_part3;
  short cnt_label1_part2;
  short cnt_label0_part2;
  short cnt_label1_part1;
  short cnt_label0_part1;
  short cnt_label1_part0;
  short cnt_label0_part0;
  thread t2;
  char *buf;
  long local_148;
  thread t1;
  thread t0;
  vector<int,_std::allocator<int>_> sum_label1_part3;
  vector<int,_std::allocator<int>_> sum_label0_part3;
  reference_wrapper<std::vector<int,_std::allocator<int>_>_> local_100;
  vector<int,_std::allocator<int>_> sum_label1_part2;
  vector<int,_std::allocator<int>_> sum_label0_part2;
  vector<int,_std::allocator<int>_> sum_label1_part1;
  vector<int,_std::allocator<int>_> sum_label0_part1;
  reference_wrapper<short> local_80;
  reference_wrapper<std::vector<int,_std::allocator<int>_>_> local_78;
  int local_70 [2];
  vector<int,_std::allocator<int>_> sum_label1_part0;
  vector<int,_std::allocator<int>_> sum_label0_part0;
  reference_wrapper<short> local_38;
  
  cVar5 = clock();
  __fd = open((filename->_M_dataplus)._M_p,0);
  buf = (char *)mmap((void *)0x0,0xbc2000,1,2,__fd,0);
  close(__fd);
  sum_label1_part0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&sum_label0_part0,(long)features_num,(value_type_conflict2 *)&sum_label1_part0,
             (allocator_type *)&sum_label0_part1);
  sum_label0_part1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)sum_label0_part1.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start._4_4_ << 0x20);
  std::vector<int,_std::allocator<int>_>::vector
            (&sum_label1_part0,(long)features_num,(value_type_conflict2 *)&sum_label0_part1,
             (allocator_type *)&sum_label1_part1);
  sum_label0_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&cnt_label0_part0;
  cnt_label0_part0 = 0;
  sum_label1_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&cnt_label1_part0;
  cnt_label1_part0 = 0;
  sum_label0_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)sum_label0_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start._4_4_ << 0x20);
  sum_label1_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(sum_label1_part3.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,400);
  sum_label1_part1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&sum_label1_part0;
  sum_label0_part1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&sum_label0_part0;
  std::thread::
  thread<void(&)(char*,int,int,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,short&,short&),char*&,int,int,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<short>,std::reference_wrapper<short>,void>
            (&t0,CalcTrainSum,&buf,(int *)&sum_label0_part3,(int *)&sum_label1_part3,
             (reference_wrapper<std::vector<int,_std::allocator<int>_>_> *)&sum_label0_part1,
             (reference_wrapper<std::vector<int,_std::allocator<int>_>_> *)&sum_label1_part1,
             (reference_wrapper<short> *)&sum_label0_part2,
             (reference_wrapper<short> *)&sum_label1_part2);
  sum_label1_part1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)sum_label1_part1.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::vector
            (&sum_label0_part1,(long)features_num,(value_type_conflict2 *)&sum_label1_part1,
             (allocator_type *)&sum_label0_part2);
  sum_label0_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)sum_label0_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::vector
            (&sum_label1_part1,(long)features_num,(value_type_conflict2 *)&sum_label0_part2,
             (allocator_type *)&sum_label1_part2);
  sum_label0_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&cnt_label0_part1;
  cnt_label0_part1 = 0;
  sum_label1_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&cnt_label1_part1;
  cnt_label1_part1 = 0;
  t2._M_id._M_thread._0_4_ = 400;
  t3._M_id._M_thread._0_4_ = 400;
  sum_label1_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&sum_label1_part1;
  sum_label0_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&sum_label0_part1;
  std::thread::
  thread<void(&)(char*,int,int,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,short&,short&),char*&,int,int,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<short>,std::reference_wrapper<short>,void>
            (&t1,CalcTrainSum,&buf,(int *)&t2,(int *)&t3,
             (reference_wrapper<std::vector<int,_std::allocator<int>_>_> *)&sum_label0_part2,
             (reference_wrapper<std::vector<int,_std::allocator<int>_>_> *)&sum_label1_part2,
             (reference_wrapper<short> *)&sum_label0_part3,
             (reference_wrapper<short> *)&sum_label1_part3);
  sum_label1_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)sum_label1_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::vector
            (&sum_label0_part2,(long)features_num,(value_type_conflict2 *)&sum_label1_part2,
             (allocator_type *)&sum_label0_part3);
  sum_label0_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)sum_label0_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::vector
            (&sum_label1_part2,(long)features_num,(value_type_conflict2 *)&sum_label0_part3,
             (allocator_type *)&sum_label1_part3);
  t3._M_id._M_thread = (id)&cnt_label0_part2;
  cnt_label0_part2 = 0;
  local_100._M_data = (vector<int,_std::allocator<int>_> *)&cnt_label1_part2;
  cnt_label1_part2 = 0;
  local_78._M_data._0_4_ = 800;
  local_80._M_data._0_4_ = 400;
  sum_label1_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&sum_label1_part2;
  sum_label0_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&sum_label0_part2;
  std::thread::
  thread<void(&)(char*,int,int,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,short&,short&),char*&,int,int,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<short>,std::reference_wrapper<short>,void>
            (&t2,CalcTrainSum,&buf,(int *)&local_78,(int *)&local_80,
             (reference_wrapper<std::vector<int,_std::allocator<int>_>_> *)&sum_label0_part3,
             (reference_wrapper<std::vector<int,_std::allocator<int>_>_> *)&sum_label1_part3,
             (reference_wrapper<short> *)&t3,(reference_wrapper<short> *)&local_100);
  sum_label1_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)sum_label1_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::vector
            (&sum_label0_part3,(long)features_num,(value_type_conflict2 *)&sum_label1_part3,
             (allocator_type *)&t3);
  t3._M_id._M_thread = (id)((ulong)t3._M_id._M_thread & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::vector
            (&sum_label1_part3,(long)features_num,(value_type_conflict2 *)&t3,
             (allocator_type *)&local_100);
  local_80._M_data = &cnt_label0_part3;
  cnt_label0_part3 = 0;
  local_38._M_data = &cnt_label1_part3;
  cnt_label1_part3 = 0;
  local_70[1] = 0x4b0;
  local_70[0] = 400;
  local_100._M_data = &sum_label0_part3;
  local_78._M_data = &sum_label1_part3;
  std::thread::
  thread<void(&)(char*,int,int,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,short&,short&),char*&,int,int,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<short>,std::reference_wrapper<short>,void>
            (&t3,CalcTrainSum,&buf,local_70 + 1,local_70,&local_100,&local_78,&local_80,&local_38);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  psVar4 = means_sub.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar3 = means_add.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_148 = (long)features_num;
  if (0 < local_148) {
    local_148 = local_148 * 2;
    lVar7 = 0;
    do {
      sVar1 = (short)((*(int *)((long)sum_label0_part1.super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar7 * 2) +
                       *(int *)((long)sum_label0_part0.super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar7 * 2) +
                       *(int *)((long)sum_label0_part2.super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar7 * 2) +
                      *(int *)((long)sum_label0_part3.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar7 * 2)) /
                     (int)(short)(cnt_label0_part1 + cnt_label0_part0 + cnt_label0_part2 +
                                 cnt_label0_part3));
      sVar2 = (short)((*(int *)((long)sum_label1_part1.super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar7 * 2) +
                       *(int *)(CONCAT44(sum_label1_part0.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start._4_4_,
                                         sum_label1_part0.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start._0_4_) + lVar7 * 2) +
                       *(int *)((long)sum_label1_part2.super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar7 * 2) +
                      *(int *)((long)sum_label1_part3.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar7 * 2)) /
                     (int)(short)(cnt_label1_part1 + cnt_label1_part0 + cnt_label1_part2 +
                                 cnt_label1_part3));
      *(short *)((long)psVar3 + lVar7) = sVar2 + sVar1;
      *(short *)((long)psVar4 + lVar7) = sVar2 - sVar1;
      C = (sVar1 - sVar2) * (sVar2 + sVar1);
      lVar7 = lVar7 + 2;
    } while (local_148 != lVar7);
  }
  C = C / 200;
  cVar6 = clock();
  printf(anon_var_dwarf_8f20,(double)(cVar6 - cVar5) / 1000000.0);
  if (t3._M_id._M_thread != 0) {
    std::terminate();
  }
  if (sum_label1_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(sum_label1_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (sum_label0_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(sum_label0_part3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (CONCAT44(t2._M_id._M_thread._4_4_,(undefined4)t2._M_id._M_thread) != 0) {
    std::terminate();
  }
  if (sum_label1_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(sum_label1_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (sum_label0_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(sum_label0_part2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (t1._M_id._M_thread != 0) {
    std::terminate();
  }
  if (sum_label1_part1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(sum_label1_part1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (sum_label0_part1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(sum_label0_part1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (t0._M_id._M_thread != 0) {
    std::terminate();
  }
  if ((void *)CONCAT44(sum_label1_part0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       sum_label1_part0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(sum_label1_part0.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     sum_label1_part0.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (sum_label0_part0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(sum_label0_part0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Train (const string & filename) {

#ifdef TEST
    clock_t start_time = clock();
#endif

    int fd = open(filename.c_str(), O_RDONLY);

    int buf_len = 10 * 1024 * 1204;
    char * buf = (char *) mmap(NULL, buf_len, PROT_READ, MAP_PRIVATE, fd, 0);

    close(fd);

    vector<int> sum_label0_part0(features_num, 0);
    vector<int> sum_label1_part0(features_num, 0);
    short cnt_label0_part0 = 0;
    short cnt_label1_part0 = 0;
    thread t0(CalcTrainSum, buf, 0, 400, ref(sum_label0_part0), ref(sum_label1_part0), ref(cnt_label0_part0), ref(cnt_label1_part0));

    vector<int> sum_label0_part1(features_num, 0);
    vector<int> sum_label1_part1(features_num, 0);
    short cnt_label0_part1 = 0;
    short cnt_label1_part1 = 0;
    thread t1(CalcTrainSum, buf, 400, 400, ref(sum_label0_part1), ref(sum_label1_part1), ref(cnt_label0_part1), ref(cnt_label1_part1));

    vector<int> sum_label0_part2(features_num, 0);
    vector<int> sum_label1_part2(features_num, 0);
    short cnt_label0_part2 = 0;
    short cnt_label1_part2 = 0;
    thread t2(CalcTrainSum, buf, 800, 400, ref(sum_label0_part2), ref(sum_label1_part2), ref(cnt_label0_part2), ref(cnt_label1_part2));

    vector<int> sum_label0_part3(features_num, 0);
    vector<int> sum_label1_part3(features_num, 0);
    short cnt_label0_part3 = 0;
    short cnt_label1_part3 = 0;
    thread t3(CalcTrainSum, buf, 1200, 400, ref(sum_label0_part3), ref(sum_label1_part3), ref(cnt_label0_part3), ref(cnt_label1_part3));

    t0.join();
    t1.join();
    t2.join();
    t3.join();

    short cnt_label0 = cnt_label0_part0 + cnt_label0_part1 + cnt_label0_part2 + cnt_label0_part3;
    short cnt_label1 = cnt_label1_part0 + cnt_label1_part1 + cnt_label1_part2 + cnt_label1_part3;
    for (int i = 0; i < features_num; i++) {
        short a =  (sum_label0_part0[i] + sum_label0_part1[i] + sum_label0_part2[i] + sum_label0_part3[i]) / cnt_label0;
        short b = (sum_label1_part0[i] + sum_label1_part1[i] + sum_label1_part2[i] + sum_label1_part3[i]) / cnt_label1;
        means_add[i] = a + b;
        means_sub[i] = b - a;
        C = (a - b) * (a + b);
    }

    C = C / 200;

#ifdef TEST
    clock_t end_time = clock();
    printf("测试集读取耗时（s）: %f \n", (double) (end_time - start_time) / CLOCKS_PER_SEC);
#endif

}